

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O1

int testnext(LexState *ls,int c)

{
  SemInfo SVar1;
  undefined4 uVar2;
  int iVar3;
  Token *pTVar4;
  
  iVar3 = 0;
  if ((ls->t).token == c) {
    iVar3 = (ls->lookahead).token;
    ls->lastline = ls->linenumber;
    if (iVar3 == 0x11f) {
      iVar3 = llex(ls,&(ls->t).seminfo);
      (ls->t).token = iVar3;
    }
    else {
      pTVar4 = &ls->lookahead;
      uVar2 = *(undefined4 *)&pTVar4->field_0x4;
      SVar1 = (ls->lookahead).seminfo;
      (ls->t).token = pTVar4->token;
      *(undefined4 *)&(ls->t).field_0x4 = uVar2;
      (ls->t).seminfo = SVar1;
      pTVar4->token = 0x11f;
    }
    iVar3 = 1;
  }
  return iVar3;
}

Assistant:

static int testnext(LexState*ls,int c){
if(ls->t.token==c){
luaX_next(ls);
return 1;
}
else return 0;
}